

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O3

void __thiscall BinHash<DnsHashEntry>::Clear(BinHash<DnsHashEntry> *this)

{
  uint uVar1;
  DnsHashEntry **ppDVar2;
  DnsHashEntry **ppDVar3;
  DnsHashEntry *x;
  DnsHashEntry *this_00;
  ulong uVar4;
  
  ppDVar3 = this->hashBin;
  if (ppDVar3 != (DnsHashEntry **)0x0) {
    uVar1 = this->tableSize;
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        this_00 = ppDVar3[uVar4];
        if (this_00 != (DnsHashEntry *)0x0) {
          ppDVar2 = ppDVar3 + uVar4;
          do {
            *ppDVar2 = this_00->HashNext;
            DnsHashEntry::~DnsHashEntry(this_00);
            operator_delete(this_00);
            ppDVar3 = this->hashBin;
            ppDVar2 = ppDVar3 + uVar4;
            this_00 = *ppDVar2;
          } while (this_00 != (DnsHashEntry *)0x0);
          uVar1 = this->tableSize;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar1);
    }
    operator_delete__(ppDVar3);
    this->hashBin = (DnsHashEntry **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }